

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgflusher.cc
# Opt level: O1

void bgflusher_switch_file(filemgr *old_file,filemgr *new_file,err_log_callback *log_callback)

{
  avl_node *node;
  openfiles_elem query;
  char acStack_548 [1296];
  avl_node local_38;
  
  if (bgflusher_initialized != '\0') {
    strcpy(acStack_548,old_file->filename);
    pthread_mutex_lock((pthread_mutex_t *)&bgf_lock);
    node = avl_search(&openfiles,&local_38,_bgflusher_cmp);
    if (node != (avl_node *)0x0) {
      avl_remove(&openfiles,node);
      strcpy((char *)(node + -0x36),new_file->filename);
      node[-0xc].right = (avl_node *)new_file;
      *(undefined4 *)&node[-1].left = 1;
      *(undefined1 *)((long)&node[-1].left + 4) = 0;
      avl_insert(&openfiles,node,_bgflusher_cmp);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&bgf_lock);
  }
  return;
}

Assistant:

void bgflusher_switch_file(struct filemgr *old_file, struct filemgr *new_file,
                           err_log_callback *log_callback)
{
    if (!bgflusher_initialized) return;

    struct avl_node *a = NULL;
    struct openfiles_elem query, *elem;

    strcpy(query.filename, old_file->filename);
    mutex_lock(&bgf_lock);
    a = avl_search(&openfiles, &query.avl, _bgflusher_cmp);
    if (a) {
        elem = _get_entry(a, struct openfiles_elem, avl);
        avl_remove(&openfiles, a);
        strcpy(elem->filename, new_file->filename);
        elem->file = new_file;
        elem->register_count = 1;
        elem->background_flush_in_progress = false;
        avl_insert(&openfiles, &elem->avl, _bgflusher_cmp);
        mutex_unlock(&bgf_lock);
    } else {
        mutex_unlock(&bgf_lock);
    }
}